

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O2

void __thiscall Inferences::CompositeSGI::~CompositeSGI(CompositeSGI *this)

{
  ~CompositeSGI(this);
  ::operator_delete(this,0x50);
  return;
}

Assistant:

CompositeSGI::~CompositeSGI() {
  for (auto gen : _generators) {
    delete gen;
  }
  for (auto simpl : _simplifiers) {
    delete simpl;
  }
}